

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithTwoIntegerParameter_Test::
TEST_MockExpectedCall_callWithTwoIntegerParameter_Test
          (TEST_MockExpectedCall_callWithTwoIntegerParameter_Test *this)

{
  TEST_MockExpectedCall_callWithTwoIntegerParameter_Test *this_local;
  
  memset(this,0,0x18);
  TEST_GROUP_CppUTestGroupMockExpectedCall::TEST_GROUP_CppUTestGroupMockExpectedCall
            (&this->super_TEST_GROUP_CppUTestGroupMockExpectedCall);
  (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_MockExpectedCall_callWithTwoIntegerParameter_Test_00335210;
  return;
}

Assistant:

TEST(MockExpectedCall, callWithTwoIntegerParameter)
{
    int expected_value = 1;
    int another_expected_value = -1;

    call->withParameter("integer1", expected_value);
    call->withParameter("integer2", another_expected_value);
    STRCMP_EQUAL("int", call->getInputParameterType("integer1").asCharString());
    STRCMP_EQUAL("int", call->getInputParameterType("integer2").asCharString());
    LONGS_EQUAL(expected_value, call->getInputParameter("integer1").getIntValue());
    LONGS_EQUAL(another_expected_value, call->getInputParameter("integer2").getIntValue());
}